

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
customCountUnits_uniqueness_Test::customCountUnits_uniqueness_Test
          (customCountUnits_uniqueness_Test *this)

{
  customCountUnits_uniqueness_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__customCountUnits_uniqueness_Test_0025d238;
  return;
}

Assistant:

TEST(customCountUnits, uniqueness)
{
    for (std::uint16_t ii = 0; ii < 16; ++ii) {
        auto cunit1 = precise::generate_custom_count_unit(ii);
        auto cunit1inv = cunit1.inv();

        EXPECT_EQ(
            precise::custom::custom_count_unit_number(cunit1.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_count_unit_number(cunit1.base_units()), ii);
        for (std::uint16_t jj = 0; jj < 16; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_count_unit(jj);
            EXPECT_FALSE(cunit1 == cunit2)
                << "Error with false comparison 1 index " << ii << "," << jj;
            EXPECT_FALSE(cunit1 == cunit2.inv())
                << "Error with false comparison 1 inv index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2)
                << "Error with false inv comparison 2 index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2.inv())
                << "Error with false inv comparison 2 inv index " << ii << ","
                << jj;
        }
    }
}